

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod.c
# Opt level: O3

void readmod(byte *bc,int64_t sz)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  char *__s;
  LLVMModuleRef llMod;
  size_t l;
  char *err;
  char outName [256];
  undefined8 local_158;
  undefined8 local_150;
  long local_148;
  undefined8 local_140;
  char local_138 [264];
  
  local_158 = 0;
  local_150 = 0;
  if (debug != 0) {
    printf("readmod: %p %ld [%lx]\n",bc,sz,sz);
    dump(bc,0,sz,4,"\t");
    puts("\t...");
    uVar7 = sz + 0xf;
    if (-1 < sz) {
      uVar7 = sz;
    }
    dump(bc,(uVar7 & 0xfffffffffffffff0) - 0x40,sz + 0x10,6,"\t");
  }
  lVar2 = LLVMCreateMemoryBufferWithMemoryRange(bc,sz,"tmp",0);
  if (lVar2 == 0) {
    puts("could not create memory buffer");
    return;
  }
  if (debug != 0) {
    printf("parsing file: %ld bytes\n",sz);
  }
  iVar1 = LLVMParseBitcode2(lVar2,&local_158);
  if (iVar1 == 0) {
    uVar3 = LLVMGetSourceFileName(local_158,&local_150);
    uVar4 = LLVMGetTarget(local_158);
    uVar5 = LLVMGetDataLayoutStr(local_158);
    printf("module: %s / %s / %s\n",uVar3,uVar4,uVar5);
    id = id + 1;
    __s = local_138;
    snprintf(__s,0x100,"%05d-%s.ll",(ulong)(uint)id,uVar3);
    do {
      if (*__s == '/') {
        *__s = '-';
      }
      else if (*__s == '\0') goto LAB_001f0530;
      __s = __s + 1;
    } while( true );
  }
  puts("could not parse bitcode");
LAB_001f0488:
  LLVMDisposeMemoryBuffer(lVar2);
  return;
LAB_001f0530:
  local_140 = 0;
  iVar1 = LLVMPrintModuleToFile(local_158,local_138);
  if (iVar1 != 0) {
    printf(" - failed to save %s: %s\n",local_138,local_140);
    return;
  }
  local_148 = lVar2;
  lVar2 = LLVMGetFirstGlobal(local_158);
  if (lVar2 != 0) {
    do {
      uVar3 = LLVMGetValueName2(lVar2,&local_150);
      uVar4 = LLVMTypeOf(lVar2);
      iVar1 = LLVMIsDeclaration(lVar2);
      uVar4 = LLVMPrintTypeToString(uVar4);
      printf("\t%c: %s: %s\n",(ulong)((uint)(iVar1 == 0) * 2 + 0x45),uVar3,uVar4);
      lVar2 = LLVMGetNextGlobal(lVar2);
    } while (lVar2 != 0);
  }
  lVar2 = LLVMGetFirstGlobalAlias(local_158);
  if (lVar2 != 0) {
    do {
      uVar3 = LLVMGetValueName2(lVar2,&local_150);
      uVar4 = LLVMTypeOf(lVar2);
      uVar4 = LLVMPrintTypeToString(uVar4);
      printf("\tA: %s: %s\n",uVar3,uVar4);
      lVar2 = LLVMGetNextGlobalAlias(lVar2);
    } while (lVar2 != 0);
  }
  lVar6 = LLVMGetFirstFunction(local_158);
  lVar2 = local_148;
  if (lVar6 != 0) {
    do {
      uVar3 = LLVMGetValueName2(lVar6,&local_150);
      uVar4 = LLVMTypeOf(lVar6);
      iVar1 = LLVMIsDeclaration(lVar6);
      uVar4 = LLVMPrintTypeToString(uVar4);
      printf("\t%c: %s: %s\n",(ulong)((uint)(iVar1 == 0) * 2 + 0x44),uVar3,uVar4);
      lVar6 = LLVMGetNextFunction(lVar6);
      lVar2 = local_148;
    } while (lVar6 != 0);
  }
  goto LAB_001f0488;
}

Assistant:

void readmod(byte *bc, int64_t sz) {
	LLVMMemoryBufferRef bcRef = 0;
	LLVMModuleRef llMod = 0;
    LLVMValueRef llVal = 0;
	size_t l = 0;

    if (debug) {
        printf("readmod: %p %ld [%lx]\n", (void *) bc, sz, sz);
        dump(bc, 0, sz, 4, (char *) "\t");
        printf("\t...\n");
        dump(bc, ((sz/16)-4)*16, sz + 16, 6, (char *) "\t");
    }

	bcRef = LLVMCreateMemoryBufferWithMemoryRange((const char *) bc, sz, "tmp", 0);
	if (bcRef == 0) {
		printf("could not create memory buffer\n");
		return;
	}

    if (debug) {
        printf("parsing file: %ld bytes\n", sz);
    }

	if (LLVMParseBitcode2(bcRef, &llMod)) {
		printf("could not parse bitcode\n");
		LLVMDisposeMemoryBuffer(bcRef);
		return;
	}

    const char *modName = LLVMGetSourceFileName(llMod, &l);

	printf("module: %s / %s / %s\n",
        modName, LLVMGetTarget(llMod), LLVMGetDataLayoutStr(llMod));

    char outName[256];
    id += 1;
    snprintf(outName, 256, "%05d-%s.ll", id, modName);

	for (int i = 0; outName[i] != 0; i++) {
		if (outName[i] == '/') {
			outName[i] = '-';
		}
	}

    char *err = 0;
    LLVMBool saved = LLVMPrintModuleToFile(llMod, outName, &err);
    if (saved != 0) {
        printf(" - failed to save %s: %s\n", outName, err);
        return;
    }

    // globals

    llVal = LLVMGetFirstGlobal(llMod);
    while (llVal != 0) {
        const char *fnName = LLVMGetValueName2(llVal, &l);
        LLVMTypeRef tyRef = LLVMTypeOf(llVal);
        LLVMBool isDecl = LLVMIsDeclaration(llVal);
        printf("\t%c: %s: %s\n", isDecl ? 'E' : 'G', fnName, LLVMPrintTypeToString(tyRef));

        // 
        // LLVMTypeKind typeKind = LLVMGetTypeKind(typeRef);
        llVal = LLVMGetNextGlobal(llVal);
    }

    // aliases

    llVal = LLVMGetFirstGlobalAlias(llMod);
    while (llVal != 0) {
        const char *fnName = LLVMGetValueName2(llVal, &l);
        LLVMTypeRef tyRef = LLVMTypeOf(llVal);
        printf("\tA: %s: %s\n", fnName, LLVMPrintTypeToString(tyRef));

        // 
        // LLVMTypeKind typeKind = LLVMGetTypeKind(typeRef);
        llVal = LLVMGetNextGlobalAlias(llVal);
    }

    // functions

    llVal = LLVMGetFirstFunction(llMod);
    while (llVal != 0) {
        const char *fnName = LLVMGetValueName2(llVal, &l);
        LLVMTypeRef tyRef = LLVMTypeOf(llVal);
        LLVMBool isDecl = LLVMIsDeclaration(llVal);
        printf("\t%c: %s: %s\n", isDecl ? 'D' : 'F', fnName, LLVMPrintTypeToString(tyRef));

        // if (isDecl == 0) {
        //    analyseFn(llVal);
        // }
        
        llVal = LLVMGetNextFunction(llVal);
    }

	LLVMDisposeMemoryBuffer(bcRef);
}